

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O2

void simple_print_token(simple_token *t,unsigned_short depth,char *string)

{
  uint uVar1;
  bool bVar2;
  
  if (t != (simple_token *)0x0) {
    uVar1 = (uint)depth;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      fputc(9,_stderr);
    }
    if (string == (char *)0x0) {
      fprintf(_stderr,"* (%d) %lu:%lu\n",(ulong)t->type);
    }
    else {
      fprintf(_stderr,"* (%d) %lu:%lu\t\'%.*s\'\n",(ulong)t->type,t->start,t->len,
              t->len & 0xffffffff,string + t->start);
    }
    if (t->child != (simple_token *)0x0) {
      simple_print_token_tree(t->child,depth + 1,string);
      return;
    }
  }
  return;
}

Assistant:

void simple_print_token(simple_token * t, unsigned short depth, const char * string) {
	if (t != NULL) {
		for (int i = 0; i < depth; ++i) {
			fprintf(stderr, "\t");
		}

		if (string == NULL) {
			fprintf(stderr, "* (%d) %lu:%lu\n", t->type, t->start, t->len);
		} else {
			fprintf(stderr, "* (%d) %lu:%lu\t'%.*s'\n", t->type, t->start, t->len, (int)t->len, &string[t->start]);
		}

		if (t->child != NULL) {
			simple_print_token_tree(t->child, depth + 1, string);
		}
	}
}